

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::UnaryFunctionLayerParams::UnaryFunctionLayerParams
          (UnaryFunctionLayerParams *this,UnaryFunctionLayerParams *from)

{
  void *pvVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__UnaryFunctionLayerParams_0040d490;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->scale_ = from->scale_;
  fVar2 = from->alpha_;
  fVar3 = from->epsilon_;
  fVar4 = from->shift_;
  this->type_ = from->type_;
  this->alpha_ = fVar2;
  this->epsilon_ = fVar3;
  this->shift_ = fVar4;
  return;
}

Assistant:

UnaryFunctionLayerParams::UnaryFunctionLayerParams(const UnaryFunctionLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&type_, &from.type_,
    reinterpret_cast<char*>(&scale_) -
    reinterpret_cast<char*>(&type_) + sizeof(scale_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.UnaryFunctionLayerParams)
}